

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_get_topic(Curl_easy *data,char **topic,size_t *topiclen)

{
  char *__s;
  size_t sVar1;
  CURLcode local_2c;
  CURLcode result;
  char *path;
  size_t *topiclen_local;
  char **topic_local;
  Curl_easy *data_local;
  
  __s = (data->state).up.path;
  local_2c = CURLE_URL_MALFORMAT;
  sVar1 = strlen(__s);
  if (sVar1 < 2) {
    Curl_failf(data,"No MQTT topic found. Forgot to URL encode it?");
  }
  else {
    local_2c = Curl_urldecode(__s + 1,0,topic,topiclen,REJECT_NADA);
    if ((local_2c == CURLE_OK) && (0xffff < *topiclen)) {
      Curl_failf(data,"Too long MQTT topic");
      local_2c = CURLE_URL_MALFORMAT;
    }
  }
  return local_2c;
}

Assistant:

static CURLcode mqtt_get_topic(struct Curl_easy *data,
                               char **topic, size_t *topiclen)
{
  char *path = data->state.up.path;
  CURLcode result = CURLE_URL_MALFORMAT;
  if(strlen(path) > 1) {
    result = Curl_urldecode(path + 1, 0, topic, topiclen, REJECT_NADA);
    if(!result && (*topiclen > 0xffff)) {
      failf(data, "Too long MQTT topic");
      result = CURLE_URL_MALFORMAT;
    }
  }
  else
    failf(data, "No MQTT topic found. Forgot to URL encode it?");

  return result;
}